

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_addiupc(DisasContext_conflict6 *ctx,int rx,int imm,int is_64_bit,int extended)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 ret;
  target_ulong arg;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int extended_local;
  int is_64_bit_local;
  int imm_local;
  int rx_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((extended == 0) || ((ctx->hflags & 0x87f800) == 0)) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    arg = pc_relative_pc(ctx);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret,arg);
    tcg_gen_addi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rx],ret,(long)imm);
    if (is_64_bit == 0) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rx],tcg_ctx_00->cpu_gpr[rx]);
    }
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_addiupc(DisasContext *ctx, int rx, int imm,
                        int is_64_bit, int extended)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (extended && (ctx->hflags & MIPS_HFLAG_BMASK)) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, t0, pc_relative_pc(ctx));
    tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], t0, imm);
    if (!is_64_bit) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], tcg_ctx->cpu_gpr[rx]);
    }

    tcg_temp_free(tcg_ctx, t0);
}